

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int parse_range_header(mg_str *header,int64_t *a,int64_t *b)

{
  void *__dest;
  char *p;
  int result;
  int64_t *b_local;
  int64_t *a_local;
  mg_str *header_local;
  
  __dest = malloc(header->len + 1);
  if (__dest == (void *)0x0) {
    header_local._4_4_ = 0;
  }
  else {
    memcpy(__dest,header->p,header->len);
    *(undefined1 *)((long)__dest + header->len) = 0;
    header_local._4_4_ = __isoc99_sscanf(__dest,"bytes=%ld-%ld",a,b);
    free(__dest);
  }
  return header_local._4_4_;
}

Assistant:

static int parse_range_header(const struct mg_str *header, int64_t *a,
                              int64_t *b) {
    /*
   * There is no snscanf. Headers are not guaranteed to be NUL-terminated,
   * so we have this. Ugh.
   */
    int result;
    char *p = (char *) MG_MALLOC(header->len + 1);
    if (p == NULL) return 0;
    memcpy(p, header->p, header->len);
    p[header->len] = '\0';
    result = sscanf(p, "bytes=%" INT64_FMT "-%" INT64_FMT, a, b);
    MG_FREE(p);
    return result;
}